

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitops.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong x_00;
  ostream *poVar7;
  uint l2;
  uint l1;
  uint t2;
  uint t1;
  uint64_t x;
  int i;
  int num_tests;
  uint sum;
  
  for (x._0_4_ = 0; (int)x < 100000000; x._0_4_ = (int)x + 1) {
    iVar1 = rand();
    iVar2 = rand();
    x_00 = (long)iVar2 | (long)iVar1 << 0x20;
    uVar3 = trailing_zeros(x_00);
    uVar4 = reference_trailing_zeros(x_00);
    uVar5 = leading_zeros<unsigned_long>(x_00);
    uVar6 = reference_leading_zeros(x_00);
    if (uVar3 != uVar4) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Error! trailing zeros: ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar3);
      poVar7 = std::operator<<(poVar7," != ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar4);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    if (uVar5 != uVar6) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Error! leading zeros: ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar5);
      poVar7 = std::operator<<(poVar7," != ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar6);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
  }
  return 0;
}

Assistant:

int main()
{
    // run a large set of random tests
    unsigned int sum = 0;
    int num_tests = 100000000;
    for (int i = 0; i < num_tests; ++i)
    {
        uint64_t x = 0;
        x |= static_cast<uint64_t>(rand()) << 32;
        x |= static_cast<uint64_t>(rand());

        unsigned int t1 = trailing_zeros(x);
        unsigned int t2 = reference_trailing_zeros(x);
        //unsigned int t2 = t1;
        //sum += t2;

        unsigned int l1 = leading_zeros(x);
        unsigned int l2 = reference_leading_zeros(x);
        //unsigned int l2 = l1;
        //sum += l2;

        if (t1 != t2) {
            std::cerr << "Error! trailing zeros: " << t1 << " != " << t2 << std::endl;
        }
        if (l1 != l2) {
            std::cerr << "Error! leading zeros: " << l1 << " != " << l2 << std::endl;
        }
    }
    return sum;
}